

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::BeginTabBarEx
               (ImGuiTabBar *tab_bar,ImRect *tab_bar_bb,ImGuiTabBarFlags flags,
               ImGuiDockNode *dock_node)

{
  float fVar1;
  float fVar2;
  bool bVar3;
  int iVar4;
  ImGuiWindow_conflict *pIVar5;
  ImGuiTabBar *pIVar6;
  ImGuiPtrOrIndex *pIVar7;
  ImVec2 IVar8;
  ImGuiContext_conflict1 *pIVar9;
  int iVar10;
  uint uVar11;
  ImU32 col;
  ImGuiPtrOrIndex *__dest;
  int iVar12;
  ImGuiTabBar *pIVar13;
  size_t __nmemb;
  ImDrawList *this;
  int iVar14;
  ImVec2 local_40;
  ImVec2 local_38;
  
  pIVar9 = GImGui;
  pIVar5 = GImGui->CurrentWindow;
  bVar3 = pIVar5->SkipItems;
  if (bVar3 == false) {
    if (((uint)flags >> 0x14 & 1) == 0) {
      PushOverrideID(tab_bar->ID);
    }
    pIVar6 = (GImGui->TabBars).Buf.Data;
    iVar10 = -1;
    pIVar13 = tab_bar;
    if ((pIVar6 <= tab_bar) && (tab_bar < pIVar6 + (GImGui->TabBars).Buf.Size)) {
      iVar10 = ImPool<ImGuiTabBar>::GetIndex(&GImGui->TabBars,tab_bar);
      pIVar13 = (ImGuiTabBar *)0x0;
    }
    iVar14 = (pIVar9->CurrentTabBarStack).Size;
    iVar4 = (pIVar9->CurrentTabBarStack).Capacity;
    if (iVar14 == iVar4) {
      iVar14 = iVar14 + 1;
      if (iVar4 == 0) {
        iVar12 = 8;
      }
      else {
        iVar12 = iVar4 / 2 + iVar4;
      }
      if (iVar14 < iVar12) {
        iVar14 = iVar12;
      }
      if (iVar4 < iVar14) {
        __dest = (ImGuiPtrOrIndex *)MemAlloc((long)iVar14 << 4);
        pIVar7 = (pIVar9->CurrentTabBarStack).Data;
        if (pIVar7 != (ImGuiPtrOrIndex *)0x0) {
          memcpy(__dest,pIVar7,(long)(pIVar9->CurrentTabBarStack).Size << 4);
          MemFree((pIVar9->CurrentTabBarStack).Data);
        }
        (pIVar9->CurrentTabBarStack).Data = __dest;
        (pIVar9->CurrentTabBarStack).Capacity = iVar14;
      }
    }
    pIVar7 = (pIVar9->CurrentTabBarStack).Data;
    iVar14 = (pIVar9->CurrentTabBarStack).Size;
    pIVar7[iVar14].Ptr = pIVar13;
    pIVar7[iVar14].Index = iVar10;
    (pIVar9->CurrentTabBarStack).Size = (pIVar9->CurrentTabBarStack).Size + 1;
    pIVar9->CurrentTabBar = tab_bar;
    tab_bar->BackupCursorPos = (pIVar5->DC).CursorPos;
    if (tab_bar->CurrFrameVisible == pIVar9->FrameCount) {
      fVar1 = (tab_bar->BarRect).Max.y;
      fVar2 = tab_bar->ItemSpacingY;
      (pIVar5->DC).CursorPos.x = (tab_bar->BarRect).Min.x;
      (pIVar5->DC).CursorPos.y = fVar1 + fVar2;
      tab_bar->BeginCount = tab_bar->BeginCount + '\x01';
    }
    else {
      if ((((flags & 1U) != (tab_bar->Flags & 1U)) ||
          (((flags & 1U) == 0 && (tab_bar->TabsAddedNew != false)))) &&
         (__nmemb = (size_t)(tab_bar->Tabs).Size,
         1 < (long)__nmemb && ((uint)flags >> 0x14 & 1) == 0)) {
        qsort((tab_bar->Tabs).Data,__nmemb,0x30,TabItemComparerByBeginOrder);
      }
      uVar11 = flags | 0x40;
      if ((flags & 0xc0U) != 0) {
        uVar11 = flags;
      }
      tab_bar->TabsAddedNew = false;
      tab_bar->Flags = uVar11;
      IVar8 = tab_bar_bb->Max;
      (tab_bar->BarRect).Min = tab_bar_bb->Min;
      (tab_bar->BarRect).Max = IVar8;
      tab_bar->WantLayout = true;
      tab_bar->PrevFrameVisible = tab_bar->CurrFrameVisible;
      tab_bar->CurrFrameVisible = pIVar9->FrameCount;
      tab_bar->PrevTabsContentsHeight = tab_bar->CurrTabsContentsHeight;
      tab_bar->CurrTabsContentsHeight = 0.0;
      fVar1 = (pIVar9->Style).ItemSpacing.y;
      tab_bar->ItemSpacingY = fVar1;
      tab_bar->FramePadding = (pIVar9->Style).FramePadding;
      tab_bar->TabsActiveCount = 0;
      tab_bar->BeginCount = '\x01';
      fVar2 = (tab_bar->BarRect).Max.y;
      (pIVar5->DC).CursorPos.x = (tab_bar->BarRect).Min.x;
      (pIVar5->DC).CursorPos.y = fVar1 + fVar2;
      col = GetColorU32((uint)((uVar11 >> 0x15 & 1) == 0) * 2 + 0x23,1.0);
      local_40.y = (tab_bar->BarRect).Max.y + -1.0;
      if (dock_node == (ImGuiDockNode *)0x0) {
        local_40.x = (float)(int)((pIVar5->WindowPadding).x * 0.5);
        local_38.x = (tab_bar->BarRect).Min.x - local_40.x;
        local_40.x = (tab_bar->BarRect).Max.x + local_40.x;
        this = pIVar5->DrawList;
      }
      else {
        fVar1 = (dock_node->Pos).x;
        local_38.x = fVar1 + pIVar5->WindowBorderSize;
        local_40.x = (fVar1 + (dock_node->Size).x) - pIVar5->WindowBorderSize;
        this = pIVar5->DrawList;
      }
      local_38.y = local_40.y;
      ImDrawList::AddLine(this,&local_38,&local_40,col,1.0);
    }
  }
  return (bool)(bVar3 ^ 1);
}

Assistant:

bool    ImGui::BeginTabBarEx(ImGuiTabBar* tab_bar, const ImRect& tab_bar_bb, ImGuiTabBarFlags flags, ImGuiDockNode* dock_node)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return false;

    if ((flags & ImGuiTabBarFlags_DockNode) == 0)
        PushOverrideID(tab_bar->ID);

    // Add to stack
    g.CurrentTabBarStack.push_back(GetTabBarRefFromTabBar(tab_bar));
    g.CurrentTabBar = tab_bar;

    // Append with multiple BeginTabBar()/EndTabBar() pairs.
    tab_bar->BackupCursorPos = window->DC.CursorPos;
    if (tab_bar->CurrFrameVisible == g.FrameCount)
    {
        window->DC.CursorPos = ImVec2(tab_bar->BarRect.Min.x, tab_bar->BarRect.Max.y + tab_bar->ItemSpacingY);
        tab_bar->BeginCount++;
        return true;
    }

    // Ensure correct ordering when toggling ImGuiTabBarFlags_Reorderable flag, or when a new tab was added while being not reorderable
    if ((flags & ImGuiTabBarFlags_Reorderable) != (tab_bar->Flags & ImGuiTabBarFlags_Reorderable) || (tab_bar->TabsAddedNew && !(flags & ImGuiTabBarFlags_Reorderable)))
        if (tab_bar->Tabs.Size > 1 && (flags & ImGuiTabBarFlags_DockNode) == 0) // FIXME: TabBar with DockNode can now be hybrid
            ImQsort(tab_bar->Tabs.Data, tab_bar->Tabs.Size, sizeof(ImGuiTabItem), TabItemComparerByBeginOrder);
    tab_bar->TabsAddedNew = false;

    // Flags
    if ((flags & ImGuiTabBarFlags_FittingPolicyMask_) == 0)
        flags |= ImGuiTabBarFlags_FittingPolicyDefault_;

    tab_bar->Flags = flags;
    tab_bar->BarRect = tab_bar_bb;
    tab_bar->WantLayout = true; // Layout will be done on the first call to ItemTab()
    tab_bar->PrevFrameVisible = tab_bar->CurrFrameVisible;
    tab_bar->CurrFrameVisible = g.FrameCount;
    tab_bar->PrevTabsContentsHeight = tab_bar->CurrTabsContentsHeight;
    tab_bar->CurrTabsContentsHeight = 0.0f;
    tab_bar->ItemSpacingY = g.Style.ItemSpacing.y;
    tab_bar->FramePadding = g.Style.FramePadding;
    tab_bar->TabsActiveCount = 0;
    tab_bar->BeginCount = 1;

    // Set cursor pos in a way which only be used in the off-chance the user erroneously submits item before BeginTabItem(): items will overlap
    window->DC.CursorPos = ImVec2(tab_bar->BarRect.Min.x, tab_bar->BarRect.Max.y + tab_bar->ItemSpacingY);

    // Draw separator
    const ImU32 col = GetColorU32((flags & ImGuiTabBarFlags_IsFocused) ? ImGuiCol_TabActive : ImGuiCol_TabUnfocusedActive);
    const float y = tab_bar->BarRect.Max.y - 1.0f;
    if (dock_node != NULL)
    {
        const float separator_min_x = dock_node->Pos.x + window->WindowBorderSize;
        const float separator_max_x = dock_node->Pos.x + dock_node->Size.x - window->WindowBorderSize;
        window->DrawList->AddLine(ImVec2(separator_min_x, y), ImVec2(separator_max_x, y), col, 1.0f);
    }
    else
    {
        const float separator_min_x = tab_bar->BarRect.Min.x - IM_FLOOR(window->WindowPadding.x * 0.5f);
        const float separator_max_x = tab_bar->BarRect.Max.x + IM_FLOOR(window->WindowPadding.x * 0.5f);
        window->DrawList->AddLine(ImVec2(separator_min_x, y), ImVec2(separator_max_x, y), col, 1.0f);
    }
    return true;
}